

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_ecdsa_recovery_edge_cases(void)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  secp256k1_pubkey pubkeyc;
  uchar sigc64 [64];
  uchar sigcder [8];
  uchar orig;
  int c;
  secp256k1_pubkey pubkey2b;
  uchar sigbderlong [40];
  uchar sigbderalt4 [40];
  uchar sigbderalt3 [40];
  uchar sigbderalt2 [39];
  uchar sigbderalt1 [39];
  uchar sigcder_zs [7];
  uchar sigcder_zr [7];
  uchar sigbder [8];
  int recid2;
  int i;
  int recid;
  secp256k1_ecdsa_signature sig;
  secp256k1_ecdsa_recoverable_signature rsig;
  secp256k1_pubkey pubkeyb;
  uchar sigb64 [64];
  secp256k1_pubkey pubkey;
  uchar sig64 [64];
  uchar msg32 [32];
  size_t in_stack_fffffffffffffca0;
  uchar *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcb4;
  secp256k1_context *in_stack_fffffffffffffcb8;
  secp256k1_ecdsa_recoverable_signature *in_stack_fffffffffffffcc0;
  secp256k1_context *in_stack_fffffffffffffcc8;
  uint local_2fc;
  secp256k1_pubkey *in_stack_fffffffffffffd20;
  secp256k1_ecdsa_recoverable_signature *in_stack_fffffffffffffd28;
  secp256k1_ecdsa_signature *in_stack_fffffffffffffd30;
  secp256k1_context *in_stack_fffffffffffffd38;
  undefined1 local_2b8 [48];
  undefined1 local_288 [7];
  undefined1 local_281;
  undefined1 local_258 [4];
  undefined1 local_254;
  undefined1 local_228 [48];
  undefined1 local_1f8 [42];
  undefined4 local_1ce;
  undefined2 local_1ca;
  undefined1 local_1c8;
  undefined4 local_1c7;
  undefined2 local_1c3;
  undefined1 local_1c1;
  byte local_1c0 [8];
  int local_1b8;
  int local_1b4;
  int local_1b0;
  undefined1 local_e8 [31];
  undefined1 local_c9;
  undefined1 local_a9;
  undefined1 local_68 [64];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_28 = 0x2073692073696854;
  local_20 = 0x7320797265762061;
  local_18 = 0x656d207465726365;
  local_10 = 0x2e2e2e6567617373;
  memcpy(local_68,&DAT_00177190,0x40);
  memset(local_e8,0,0x40);
  local_c9 = 4;
  local_a9 = 4;
  iVar2 = secp256k1_ecdsa_recoverable_signature_parse_compact
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (uchar *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0xbe,
            "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sig64, 0)"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_recover
                    (in_stack_fffffffffffffd38,(secp256k1_pubkey *)in_stack_fffffffffffffd30,
                     in_stack_fffffffffffffd28,in_stack_fffffffffffffd20->data);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0xbf,"test condition failed: !secp256k1_ecdsa_recover(CTX, &pubkey, &rsig, msg32)");
    abort();
  }
  iVar2 = secp256k1_ecdsa_recoverable_signature_parse_compact
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (uchar *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0xc0,
            "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sig64, 1)"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_recover
                    (in_stack_fffffffffffffd38,(secp256k1_pubkey *)in_stack_fffffffffffffd30,
                     in_stack_fffffffffffffd28,in_stack_fffffffffffffd20->data);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0xc1,"test condition failed: secp256k1_ecdsa_recover(CTX, &pubkey, &rsig, msg32)");
    abort();
  }
  iVar2 = secp256k1_ecdsa_recoverable_signature_parse_compact
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (uchar *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0xc2,
            "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sig64, 2)"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_recover
                    (in_stack_fffffffffffffd38,(secp256k1_pubkey *)in_stack_fffffffffffffd30,
                     in_stack_fffffffffffffd28,in_stack_fffffffffffffd20->data);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0xc3,"test condition failed: !secp256k1_ecdsa_recover(CTX, &pubkey, &rsig, msg32)");
    abort();
  }
  iVar2 = secp256k1_ecdsa_recoverable_signature_parse_compact
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (uchar *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0xc4,
            "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sig64, 3)"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_recover
                    (in_stack_fffffffffffffd38,(secp256k1_pubkey *)in_stack_fffffffffffffd30,
                     in_stack_fffffffffffffd28,in_stack_fffffffffffffd20->data);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
            ,0xc5,"test condition failed: !secp256k1_ecdsa_recover(CTX, &pubkey, &rsig, msg32)");
    abort();
  }
  local_1b0 = 0;
  while( true ) {
    if (3 < local_1b0) {
      memset(&stack0xfffffffffffffcb8,0,0x40);
      iVar2 = secp256k1_ecdsa_recoverable_signature_parse_compact
                        (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                         (uchar *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4);
      if (iVar2 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
                ,0x132,
                "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sigc64, 0) == 1"
               );
        abort();
      }
      iVar2 = secp256k1_ecdsa_recover
                        (in_stack_fffffffffffffd38,(secp256k1_pubkey *)in_stack_fffffffffffffd30,
                         in_stack_fffffffffffffd28,in_stack_fffffffffffffd20->data);
      if (iVar2 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
                ,0x133,
                "test condition failed: secp256k1_ecdsa_recover(CTX, &pubkeyc, &rsig, msg32) == 1");
        abort();
      }
      iVar2 = secp256k1_ecdsa_signature_parse_der
                        (in_stack_fffffffffffffcb8,
                         (secp256k1_ecdsa_signature *)
                         CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
      if (iVar2 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
                ,0x134,
                "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigcder, sizeof(sigcder)) == 1"
               );
        abort();
      }
      iVar2 = secp256k1_ecdsa_verify
                        (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                         in_stack_fffffffffffffd28->data,in_stack_fffffffffffffd20);
      if (iVar2 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
                ,0x135,
                "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyc) == 1");
        abort();
      }
      iVar2 = secp256k1_ecdsa_recoverable_signature_parse_compact
                        (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                         (uchar *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4);
      if (iVar2 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
                ,0x138,
                "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sigc64, 0) == 1"
               );
        abort();
      }
      iVar2 = secp256k1_ecdsa_recover
                        (in_stack_fffffffffffffd38,(secp256k1_pubkey *)in_stack_fffffffffffffd30,
                         in_stack_fffffffffffffd28,in_stack_fffffffffffffd20->data);
      if (iVar2 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
                ,0x139,
                "test condition failed: secp256k1_ecdsa_recover(CTX, &pubkeyb, &rsig, msg32) == 0");
        abort();
      }
      iVar2 = secp256k1_ecdsa_signature_parse_der
                        (in_stack_fffffffffffffcb8,
                         (secp256k1_ecdsa_signature *)
                         CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
      if (iVar2 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
                ,0x13a,
                "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigcder, sizeof(sigcder)) == 1"
               );
        abort();
      }
      iVar2 = secp256k1_ecdsa_verify
                        (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                         in_stack_fffffffffffffd28->data,in_stack_fffffffffffffd20);
      if (iVar2 == 0) {
        iVar2 = secp256k1_ecdsa_recoverable_signature_parse_compact
                          (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                           (uchar *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4);
        if (iVar2 != 1) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
                  ,0x140,
                  "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sigc64, 0) == 1"
                 );
          abort();
        }
        iVar2 = secp256k1_ecdsa_recover
                          (in_stack_fffffffffffffd38,(secp256k1_pubkey *)in_stack_fffffffffffffd30,
                           in_stack_fffffffffffffd28,in_stack_fffffffffffffd20->data);
        if (iVar2 != 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
                  ,0x141,
                  "test condition failed: secp256k1_ecdsa_recover(CTX, &pubkeyb, &rsig, msg32) == 0"
                 );
          abort();
        }
        iVar2 = secp256k1_ecdsa_signature_parse_der
                          (in_stack_fffffffffffffcb8,
                           (secp256k1_ecdsa_signature *)
                           CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                           in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
        if (iVar2 != 1) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
                  ,0x142,
                  "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigcder, sizeof(sigcder)) == 1"
                 );
          abort();
        }
        iVar2 = secp256k1_ecdsa_verify
                          (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                           in_stack_fffffffffffffd28->data,in_stack_fffffffffffffd20);
        if (iVar2 == 0) {
          return;
        }
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
                ,0x143,
                "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyc) == 0");
        abort();
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0x13b,
              "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyc) == 0");
      abort();
    }
    local_1c0[0] = 0x30;
    local_1c0[1] = 6;
    local_1c0[2] = 2;
    local_1c0[3] = 1;
    local_1c0[4] = 4;
    local_1c0[5] = 2;
    local_1c0[6] = 1;
    local_1c0[7] = 4;
    local_1c7 = 0x20530;
    local_1c3 = 0x102;
    local_1c1 = 1;
    local_1ce = 0x1020530;
    local_1ca = 0x201;
    local_1c8 = 0;
    memcpy(local_1f8,&DAT_001771e0,0x27);
    memcpy(local_228,&DAT_00177210,0x27);
    memcpy(local_258,&DAT_00177240,0x28);
    memcpy(local_288,&DAT_00177270,0x28);
    memcpy(local_2b8,&DAT_001772a0,0x28);
    iVar2 = secp256k1_ecdsa_recoverable_signature_parse_compact
                      (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                       (uchar *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0xf2,
              "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sigb64, recid) == 1"
             );
      abort();
    }
    iVar2 = secp256k1_ecdsa_recover
                      (in_stack_fffffffffffffd38,(secp256k1_pubkey *)in_stack_fffffffffffffd30,
                       in_stack_fffffffffffffd28,in_stack_fffffffffffffd20->data);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0xf3,
              "test condition failed: secp256k1_ecdsa_recover(CTX, &pubkeyb, &rsig, msg32) == 1");
      abort();
    }
    iVar2 = secp256k1_ecdsa_signature_parse_der
                      (in_stack_fffffffffffffcb8,
                       (secp256k1_ecdsa_signature *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0xf4,
              "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbder, sizeof(sigbder)) == 1"
             );
      abort();
    }
    iVar2 = secp256k1_ecdsa_verify
                      (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                       in_stack_fffffffffffffd28->data,in_stack_fffffffffffffd20);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0xf5,"test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 1"
             );
      abort();
    }
    for (local_1b8 = 0; local_1b8 < 4; local_1b8 = local_1b8 + 1) {
      iVar2 = secp256k1_ecdsa_recoverable_signature_parse_compact
                        (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                         (uchar *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4);
      if (iVar2 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
                ,0xf8,
                "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sigb64, recid2) == 1"
               );
        abort();
      }
      iVar2 = secp256k1_ecdsa_recover
                        (in_stack_fffffffffffffd38,(secp256k1_pubkey *)in_stack_fffffffffffffd30,
                         in_stack_fffffffffffffd28,in_stack_fffffffffffffd20->data);
      if (iVar2 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
                ,0xf9,
                "test condition failed: secp256k1_ecdsa_recover(CTX, &pubkey2b, &rsig, msg32) == 1")
        ;
        abort();
      }
      iVar2 = secp256k1_ecdsa_signature_parse_der
                        (in_stack_fffffffffffffcb8,
                         (secp256k1_ecdsa_signature *)
                         CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
      if (iVar2 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
                ,0xfb,
                "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderlong, sizeof(sigbderlong)) == 1"
               );
        abort();
      }
      iVar2 = secp256k1_ecdsa_verify
                        (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                         in_stack_fffffffffffffd28->data,in_stack_fffffffffffffd20);
      if (iVar2 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
                ,0xfc,
                "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 0");
        abort();
      }
    }
    iVar2 = secp256k1_ecdsa_signature_parse_der
                      (in_stack_fffffffffffffcb8,
                       (secp256k1_ecdsa_signature *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0x100,
              "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigcder_zr, sizeof(sigcder_zr)) == 0"
             );
      abort();
    }
    iVar2 = secp256k1_ecdsa_signature_parse_der
                      (in_stack_fffffffffffffcb8,
                       (secp256k1_ecdsa_signature *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0x101,
              "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigcder_zs, sizeof(sigcder_zs)) == 0"
             );
      abort();
    }
    iVar2 = secp256k1_ecdsa_signature_parse_der
                      (in_stack_fffffffffffffcb8,
                       (secp256k1_ecdsa_signature *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0x103,
              "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt1, sizeof(sigbderalt1)) == 0"
             );
      abort();
    }
    iVar2 = secp256k1_ecdsa_signature_parse_der
                      (in_stack_fffffffffffffcb8,
                       (secp256k1_ecdsa_signature *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    if (iVar2 != 0) break;
    iVar2 = secp256k1_ecdsa_signature_parse_der
                      (in_stack_fffffffffffffcb8,
                       (secp256k1_ecdsa_signature *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0x105,
              "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt3, sizeof(sigbderalt3)) == 0"
             );
      abort();
    }
    iVar2 = secp256k1_ecdsa_signature_parse_der
                      (in_stack_fffffffffffffcb8,
                       (secp256k1_ecdsa_signature *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0x106,
              "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt4, sizeof(sigbderalt4)) == 0"
             );
      abort();
    }
    local_254 = 1;
    iVar2 = secp256k1_ecdsa_signature_parse_der
                      (in_stack_fffffffffffffcb8,
                       (secp256k1_ecdsa_signature *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0x108,
              "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt3, sizeof(sigbderalt3)) == 1"
             );
      abort();
    }
    iVar2 = secp256k1_ecdsa_verify
                      (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                       in_stack_fffffffffffffd28->data,in_stack_fffffffffffffd20);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0x109,
              "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 0");
      abort();
    }
    local_281 = 1;
    iVar2 = secp256k1_ecdsa_signature_parse_der
                      (in_stack_fffffffffffffcb8,
                       (secp256k1_ecdsa_signature *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0x10b,
              "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt4, sizeof(sigbderalt4)) == 1"
             );
      abort();
    }
    iVar2 = secp256k1_ecdsa_verify
                      (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                       in_stack_fffffffffffffd28->data,in_stack_fffffffffffffd20);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0x10c,
              "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 0");
      abort();
    }
    local_1c0[7] = local_1c0[7] + '\x01';
    iVar2 = secp256k1_ecdsa_signature_parse_der
                      (in_stack_fffffffffffffcb8,
                       (secp256k1_ecdsa_signature *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0x10f,
              "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbder, sizeof(sigbder)) == 1"
             );
      abort();
    }
    iVar2 = secp256k1_ecdsa_verify
                      (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                       in_stack_fffffffffffffd28->data,in_stack_fffffffffffffd20);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0x110,
              "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 0");
      abort();
    }
    local_1c0[7] = local_1c0[7] + -1;
    iVar2 = secp256k1_ecdsa_signature_parse_der
                      (in_stack_fffffffffffffcb8,
                       (secp256k1_ecdsa_signature *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0x112,
              "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbder, 6) == 0"
             );
      abort();
    }
    iVar2 = secp256k1_ecdsa_signature_parse_der
                      (in_stack_fffffffffffffcb8,
                       (secp256k1_ecdsa_signature *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
              ,0x113,
              "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbder, sizeof(sigbder) - 1) == 0"
             );
      abort();
    }
    for (local_1b4 = 0; local_1b4 < 8; local_1b4 = local_1b4 + 1) {
      bVar1 = local_1c0[local_1b4];
      for (local_2fc = 0; (int)local_2fc < 0x100; local_2fc = local_2fc + 1) {
        if (local_2fc != bVar1) {
          local_1c0[local_1b4] = (byte)local_2fc;
          iVar2 = secp256k1_ecdsa_signature_parse_der
                            (in_stack_fffffffffffffcb8,
                             (secp256k1_ecdsa_signature *)
                             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                             in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
          bVar3 = true;
          if (iVar2 != 0) {
            iVar2 = secp256k1_ecdsa_verify
                              (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                               in_stack_fffffffffffffd28->data,in_stack_fffffffffffffd20);
            bVar3 = iVar2 == 0;
          }
          if (!bVar3) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
                    ,0x11d,
                    "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbder, sizeof(sigbder)) == 0 || secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 0"
                   );
            abort();
          }
        }
      }
      local_1c0[local_1b4] = bVar1;
    }
    local_1b0 = local_1b0 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
          ,0x104,
          "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt2, sizeof(sigbderalt2)) == 0"
         );
  abort();
}

Assistant:

static void test_ecdsa_recovery_edge_cases(void) {
    const unsigned char msg32[32] = {
        'T', 'h', 'i', 's', ' ', 'i', 's', ' ',
        'a', ' ', 'v', 'e', 'r', 'y', ' ', 's',
        'e', 'c', 'r', 'e', 't', ' ', 'm', 'e',
        's', 's', 'a', 'g', 'e', '.', '.', '.'
    };
    const unsigned char sig64[64] = {
        /* Generated by signing the above message with nonce 'This is the nonce we will use...'
         * and secret key 0 (which is not valid), resulting in recid 1. */
        0x67, 0xCB, 0x28, 0x5F, 0x9C, 0xD1, 0x94, 0xE8,
        0x40, 0xD6, 0x29, 0x39, 0x7A, 0xF5, 0x56, 0x96,
        0x62, 0xFD, 0xE4, 0x46, 0x49, 0x99, 0x59, 0x63,
        0x17, 0x9A, 0x7D, 0xD1, 0x7B, 0xD2, 0x35, 0x32,
        0x4B, 0x1B, 0x7D, 0xF3, 0x4C, 0xE1, 0xF6, 0x8E,
        0x69, 0x4F, 0xF6, 0xF1, 0x1A, 0xC7, 0x51, 0xDD,
        0x7D, 0xD7, 0x3E, 0x38, 0x7E, 0xE4, 0xFC, 0x86,
        0x6E, 0x1B, 0xE8, 0xEC, 0xC7, 0xDD, 0x95, 0x57
    };
    secp256k1_pubkey pubkey;
    /* signature (r,s) = (4,4), which can be recovered with all 4 recids. */
    const unsigned char sigb64[64] = {
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x04,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x04,
    };
    secp256k1_pubkey pubkeyb;
    secp256k1_ecdsa_recoverable_signature rsig;
    secp256k1_ecdsa_signature sig;
    int recid;

    CHECK(secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sig64, 0));
    CHECK(!secp256k1_ecdsa_recover(CTX, &pubkey, &rsig, msg32));
    CHECK(secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sig64, 1));
    CHECK(secp256k1_ecdsa_recover(CTX, &pubkey, &rsig, msg32));
    CHECK(secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sig64, 2));
    CHECK(!secp256k1_ecdsa_recover(CTX, &pubkey, &rsig, msg32));
    CHECK(secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sig64, 3));
    CHECK(!secp256k1_ecdsa_recover(CTX, &pubkey, &rsig, msg32));

    for (recid = 0; recid < 4; recid++) {
        int i;
        int recid2;
        /* (4,4) encoded in DER. */
        unsigned char sigbder[8] = {0x30, 0x06, 0x02, 0x01, 0x04, 0x02, 0x01, 0x04};
        unsigned char sigcder_zr[7] = {0x30, 0x05, 0x02, 0x00, 0x02, 0x01, 0x01};
        unsigned char sigcder_zs[7] = {0x30, 0x05, 0x02, 0x01, 0x01, 0x02, 0x00};
        unsigned char sigbderalt1[39] = {
            0x30, 0x25, 0x02, 0x20, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x04, 0x02, 0x01, 0x04,
        };
        unsigned char sigbderalt2[39] = {
            0x30, 0x25, 0x02, 0x01, 0x04, 0x02, 0x20, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x04,
        };
        unsigned char sigbderalt3[40] = {
            0x30, 0x26, 0x02, 0x21, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x04, 0x02, 0x01, 0x04,
        };
        unsigned char sigbderalt4[40] = {
            0x30, 0x26, 0x02, 0x01, 0x04, 0x02, 0x21, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x04,
        };
        /* (order + r,4) encoded in DER. */
        unsigned char sigbderlong[40] = {
            0x30, 0x26, 0x02, 0x21, 0x00, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFE, 0xBA, 0xAE, 0xDC,
            0xE6, 0xAF, 0x48, 0xA0, 0x3B, 0xBF, 0xD2, 0x5E,
            0x8C, 0xD0, 0x36, 0x41, 0x45, 0x02, 0x01, 0x04
        };
        CHECK(secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sigb64, recid) == 1);
        CHECK(secp256k1_ecdsa_recover(CTX, &pubkeyb, &rsig, msg32) == 1);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbder, sizeof(sigbder)) == 1);
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 1);
        for (recid2 = 0; recid2 < 4; recid2++) {
            secp256k1_pubkey pubkey2b;
            CHECK(secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sigb64, recid2) == 1);
            CHECK(secp256k1_ecdsa_recover(CTX, &pubkey2b, &rsig, msg32) == 1);
            /* Verifying with (order + r,4) should always fail. */
            CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderlong, sizeof(sigbderlong)) == 1);
            CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 0);
        }
        /* DER parsing tests. */
        /* Zero length r/s. */
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigcder_zr, sizeof(sigcder_zr)) == 0);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigcder_zs, sizeof(sigcder_zs)) == 0);
        /* Leading zeros. */
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt1, sizeof(sigbderalt1)) == 0);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt2, sizeof(sigbderalt2)) == 0);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt3, sizeof(sigbderalt3)) == 0);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt4, sizeof(sigbderalt4)) == 0);
        sigbderalt3[4] = 1;
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt3, sizeof(sigbderalt3)) == 1);
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 0);
        sigbderalt4[7] = 1;
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt4, sizeof(sigbderalt4)) == 1);
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 0);
        /* Damage signature. */
        sigbder[7]++;
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbder, sizeof(sigbder)) == 1);
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 0);
        sigbder[7]--;
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbder, 6) == 0);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbder, sizeof(sigbder) - 1) == 0);
        for(i = 0; i < 8; i++) {
            int c;
            unsigned char orig = sigbder[i];
            /*Try every single-byte change.*/
            for (c = 0; c < 256; c++) {
                if (c == orig ) {
                    continue;
                }
                sigbder[i] = c;
                CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbder, sizeof(sigbder)) == 0 || secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 0);
            }
            sigbder[i] = orig;
        }
    }

    /* Test r/s equal to zero */
    {
        /* (1,1) encoded in DER. */
        unsigned char sigcder[8] = {0x30, 0x06, 0x02, 0x01, 0x01, 0x02, 0x01, 0x01};
        unsigned char sigc64[64] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        secp256k1_pubkey pubkeyc;
        CHECK(secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sigc64, 0) == 1);
        CHECK(secp256k1_ecdsa_recover(CTX, &pubkeyc, &rsig, msg32) == 1);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigcder, sizeof(sigcder)) == 1);
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyc) == 1);
        sigcder[4] = 0;
        sigc64[31] = 0;
        CHECK(secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sigc64, 0) == 1);
        CHECK(secp256k1_ecdsa_recover(CTX, &pubkeyb, &rsig, msg32) == 0);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigcder, sizeof(sigcder)) == 1);
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyc) == 0);
        sigcder[4] = 1;
        sigcder[7] = 0;
        sigc64[31] = 1;
        sigc64[63] = 0;
        CHECK(secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sigc64, 0) == 1);
        CHECK(secp256k1_ecdsa_recover(CTX, &pubkeyb, &rsig, msg32) == 0);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigcder, sizeof(sigcder)) == 1);
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyc) == 0);
    }
}